

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

void __thiscall vkb::Result<vkb::Device>::destroy(Result<vkb::Device> *this)

{
  if (this->m_init != true) {
    return;
  }
  std::_Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
  ~_Vector_base(&(this->field_0).m_value.queue_families.
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
               );
  PhysicalDevice::~PhysicalDevice(&(this->field_0).m_value.physical_device);
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }